

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

QByteArray * QFileSystemEngine::id(QByteArray *__return_storage_ptr__,QFileSystemEntry *entry)

{
  bool bVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  char *__file;
  long in_FS_OFFSET;
  stat64 statResult;
  NativePath local_d8;
  stat64 local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QFileSystemEntry::isEmpty(entry);
  if (bVar1) {
    id((QFileSystemEngine *)__return_storage_ptr__);
  }
  else {
    QFileSystemEntry::nativeFilePath((NativePath *)&local_c0,entry);
    qVar3 = QByteArray::indexOf((QByteArray *)&local_c0,'\0',0);
    if ((QArrayData *)local_c0.st_dev != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c0.st_dev)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c0.st_dev)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c0.st_dev)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c0.st_dev,1,0x10);
      }
    }
    if (qVar3 == -1) {
      memset(&local_c0,0xaa,0x90);
      QFileSystemEntry::nativeFilePath(&local_d8,entry);
      __file = local_d8.d.ptr;
      if (local_d8.d.ptr == (char *)0x0) {
        __file = &QByteArray::_empty;
      }
      iVar2 = stat64(__file,&local_c0);
      if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
        }
      }
      if (iVar2 == 0) {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::number(__return_storage_ptr__,local_c0.st_dev,0x10);
        QByteArray::append(__return_storage_ptr__,':');
        QByteArray::number(&local_d8,local_c0.st_ino,10);
        QByteArray::append(__return_storage_ptr__,&local_d8);
        if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        piVar4 = __errno_location();
        if (*piVar4 != 2) {
          QFileSystemEntry::nativeFilePath(&local_d8,entry);
          if (local_d8.d.ptr == (char *)0x0) {
            local_d8.d.ptr = &QByteArray::_empty;
          }
          qErrnoWarning("stat() failed for \'%s\'",local_d8.d.ptr);
          id((QFileSystemEngine *)&local_d8);
        }
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
      }
    }
    else {
      id((QFileSystemEngine *)__return_storage_ptr__);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QFileSystemEngine::id(const QFileSystemEntry &entry)
{
    Q_CHECK_FILE_NAME(entry, QByteArray());

    QT_STATBUF statResult;
    if (QT_STAT(entry.nativeFilePath().constData(), &statResult)) {
        if (errno != ENOENT)
            qErrnoWarning("stat() failed for '%s'", entry.nativeFilePath().constData());
        return QByteArray();
    }
    QByteArray result = QByteArray::number(quint64(statResult.st_dev), 16);
    result += ':';
    result += QByteArray::number(quint64(statResult.st_ino));
    return result;
}